

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

VkSubpassDependency *
vkt::anon_unknown_0::createSubpassDependency
          (VkSubpassDependency *__return_storage_ptr__,SubpassDependency *dependencyInfo)

{
  deUint32 dVar1;
  VkPipelineStageFlags VVar2;
  VkAccessFlags VVar3;
  VkDependencyFlags VVar4;
  VkSubpassDependency *dependency;
  SubpassDependency *dependencyInfo_local;
  
  dVar1 = SubpassDependency::getSrcPass(dependencyInfo);
  __return_storage_ptr__->srcSubpass = dVar1;
  dVar1 = SubpassDependency::getDstPass(dependencyInfo);
  __return_storage_ptr__->dstSubpass = dVar1;
  VVar2 = SubpassDependency::getSrcStageMask(dependencyInfo);
  __return_storage_ptr__->srcStageMask = VVar2;
  VVar2 = SubpassDependency::getDstStageMask(dependencyInfo);
  __return_storage_ptr__->dstStageMask = VVar2;
  VVar3 = SubpassDependency::getOutputMask(dependencyInfo);
  __return_storage_ptr__->srcAccessMask = VVar3;
  VVar3 = SubpassDependency::getInputMask(dependencyInfo);
  __return_storage_ptr__->dstAccessMask = VVar3;
  VVar4 = SubpassDependency::getFlags(dependencyInfo);
  __return_storage_ptr__->dependencyFlags = VVar4;
  return __return_storage_ptr__;
}

Assistant:

VkSubpassDependency createSubpassDependency	(const SubpassDependency& dependencyInfo)
{
	const VkSubpassDependency dependency =
	{
		dependencyInfo.getSrcPass(),		// srcSubpass;
		dependencyInfo.getDstPass(),		// destSubpass;

		dependencyInfo.getSrcStageMask(),	// srcStageMask;
		dependencyInfo.getDstStageMask(),	// destStageMask;

		dependencyInfo.getOutputMask(),		// outputMask;
		dependencyInfo.getInputMask(),		// inputMask;

		dependencyInfo.getFlags()			// dependencyFlags;
	};

	return dependency;
}